

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

void __thiscall
embree::VelvetMaterial::VelvetMaterial
          (VelvetMaterial *this,Vec3fa *reflectance,float backScattering,
          Vec3fa *horizonScatteringColor,float horizonScatteringFallOff)

{
  size_type sVar1;
  undefined8 uVar2;
  undefined8 *in_RDX;
  size_type *in_RSI;
  MaterialNode *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  string *in_stack_ffffffffffffff68;
  allocator local_69;
  string local_68 [36];
  undefined4 local_44;
  undefined8 *local_40;
  undefined4 local_34;
  size_type *local_30;
  
  local_44 = in_XMM1_Da;
  local_40 = in_RDX;
  local_34 = in_XMM0_Da;
  local_30 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",&local_69);
  SceneGraph::MaterialNode::MaterialNode(in_RDI,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  (in_RDI->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__VelvetMaterial_005f0888;
  Material::Material((Material *)&in_RDI[1].super_Node.super_RefCount.refCounter,MATERIAL_VELVET);
  sVar1 = local_30[1];
  in_RDI[1].super_Node.fileName._M_string_length = *local_30;
  in_RDI[1].super_Node.fileName.field_2._M_allocated_capacity = sVar1;
  uVar2 = local_40[1];
  *(undefined8 *)((long)&in_RDI[1].super_Node.fileName.field_2 + 8) = *local_40;
  *(undefined8 *)&in_RDI[1].super_Node.name = uVar2;
  *(undefined4 *)&in_RDI[1].super_Node.name._M_string_length = local_34;
  *(undefined4 *)((long)&in_RDI[1].super_Node.name._M_string_length + 4) = local_44;
  return;
}

Assistant:

VelvetMaterial (const Vec3fa& reflectance, const float backScattering, const Vec3fa& horizonScatteringColor, const float horizonScatteringFallOff)
      : base(MATERIAL_VELVET), reflectance(reflectance), horizonScatteringColor(horizonScatteringColor), backScattering(backScattering), horizonScatteringFallOff(horizonScatteringFallOff) {}